

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

char * luna::Value::TypeName(ValueT type)

{
  if (type < (ValueT_UserData|ValueT_Number)) {
    return &DAT_001782dc + *(int *)(&DAT_001782dc + (ulong)type * 4);
  }
  return "unknown type";
}

Assistant:

const char * Value::TypeName(ValueT type)
    {
        switch (type)
        {
            case ValueT_Nil: return "nil";
            case ValueT_Bool: return "bool";
            case ValueT_Number: return "number";
            case ValueT_CFunction: return "C-Function";
            case ValueT_String: return "string";
            case ValueT_Closure: return "function";
            case ValueT_Upvalue: return "upvalue";
            case ValueT_Table: return "table";
            case ValueT_UserData: return "userdata";
            default: return "unknown type";
        }
    }